

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Read<int> __thiscall
Omega_h::interleave<int>
          (Omega_h *this,vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *arrays)

{
  int *piVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  size_t sVar5;
  Alloc *pAVar6;
  undefined8 uVar7;
  ulong *puVar8;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int n;
  Read<int> RVar12;
  Write<int> out;
  type f;
  value_type array;
  Write<int> local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [56];
  Alloc *local_40;
  Alloc *local_38;
  
  puVar2 = *(ulong **)arrays;
  puVar3 = *(ulong **)(arrays + 8);
  if (puVar2 == puVar3) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    puVar8 = (ulong *)*puVar2;
    if (((ulong)puVar8 & 1) == 0) {
      uVar11 = *puVar8;
    }
    else {
      uVar11 = (ulong)puVar8 >> 3;
    }
    n = (int)(uVar11 >> 2);
    for (puVar8 = puVar2; local_38 = (Alloc *)arrays, puVar8 != puVar3; puVar8 = puVar8 + 2) {
      puVar4 = (ulong *)*puVar8;
      if (((ulong)puVar4 & 1) == 0) {
        uVar11 = *puVar4;
      }
      else {
        uVar11 = (ulong)puVar4 >> 3;
      }
      if ((int)(uVar11 >> 2) != n) {
        fail("assertion %s failed at %s +%d\n","array.size() == array_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
             ,0x1b3);
      }
    }
    local_88._0_8_ = (Alloc *)local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
    uVar9 = (uint)((ulong)((long)puVar3 - (long)puVar2) >> 4);
    local_40 = (Alloc *)this;
    Write<int>::Write(&local_98,n * uVar9,(string *)local_88);
    if ((Alloc *)local_88._0_8_ != (Alloc *)local_78) {
      operator_delete((void *)local_88._0_8_,CONCAT44(local_78._4_4_,local_78._0_4_) + 1);
    }
    if (0 < (int)uVar9) {
      lVar10 = 8;
      uVar11 = 0;
      do {
        sVar5 = local_38->size;
        local_78._40_8_ = *(ulong *)((sVar5 - 8) + lVar10);
        if ((local_78._40_8_ & 7) == 0 && (Alloc *)local_78._40_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_78._40_8_ = ((Alloc *)local_78._40_8_)->size * 8 + 1;
          }
          else {
            ((Alloc *)local_78._40_8_)->use_count = ((Alloc *)local_78._40_8_)->use_count + 1;
          }
        }
        local_78._16_8_ = *(size_type *)(sVar5 + lVar10);
        local_88._0_8_ = local_98.shared_alloc_.alloc;
        if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
            local_98.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_88._0_8_ = (local_98.shared_alloc_.alloc)->size * 8 + 1;
          }
          else {
            (local_98.shared_alloc_.alloc)->use_count =
                 (local_98.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_88._8_8_ = local_98.shared_alloc_.direct_ptr;
        local_78._4_4_ = (undefined4)uVar11;
        local_78._8_8_ = local_78._40_8_;
        if ((local_78._40_8_ & 7) == 0 && (Alloc *)local_78._40_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_78._8_8_ = *(size_t *)local_78._40_8_ * 8 + 1;
          }
          else {
            *(int *)(local_78._40_8_ + 0x30) = *(int *)(local_78._40_8_ + 0x30) + 1;
          }
        }
        local_78._0_4_ = uVar9;
        local_78._48_8_ = local_78._16_8_;
        parallel_for<Omega_h::interleave<int>(std::vector<Omega_h::Read<int>,std::allocator<Omega_h::Read<int>>>)::_lambda(int)_1_>
                  (n,(type *)local_88,"interleave");
        uVar7 = local_78._8_8_;
        if ((local_78._8_8_ & 7) == 0 && (Alloc *)local_78._8_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_78._8_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_78._8_8_);
            operator_delete((void *)uVar7,0x48);
          }
        }
        uVar7 = local_88._0_8_;
        if ((local_88._0_8_ & 7) == 0 && (Alloc *)local_88._0_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_88._0_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_88._0_8_);
            operator_delete((void *)uVar7,0x48);
          }
        }
        uVar7 = local_78._40_8_;
        if ((local_78._40_8_ & 7) == 0 && (Alloc *)local_78._40_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_78._40_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_78._40_8_);
            operator_delete((void *)uVar7,0x48);
          }
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x10;
      } while ((uVar9 & 0x7fffffff) != uVar11);
    }
    this = (Omega_h *)local_40;
    local_78._24_8_ = local_98.shared_alloc_.alloc;
    local_78._32_8_ = local_98.shared_alloc_.direct_ptr;
    if ((((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
         local_98.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_98.shared_alloc_.alloc)->use_count = (local_98.shared_alloc_.alloc)->use_count + -1;
      local_78._24_8_ = (local_98.shared_alloc_.alloc)->size * 8 + 1;
    }
    local_98.shared_alloc_.alloc = (Alloc *)0x0;
    local_98.shared_alloc_.direct_ptr = (void *)0x0;
    Read<int>::Read((Read<signed_char> *)local_40,(Write<int> *)(local_78 + 0x18));
    uVar7 = local_78._24_8_;
    in_RDX = extraout_RDX;
    if ((local_78._24_8_ & 7) == 0 && (Alloc *)local_78._24_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_78._24_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_78._24_8_);
        operator_delete((void *)uVar7,0x48);
        in_RDX = extraout_RDX_00;
      }
    }
    pAVar6 = local_98.shared_alloc_.alloc;
    if (((ulong)local_98.shared_alloc_.alloc & 7) == 0 &&
        local_98.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_98.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_98.shared_alloc_.alloc);
        operator_delete(pAVar6,0x48);
        in_RDX = extraout_RDX_01;
      }
    }
  }
  RVar12.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar12.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar12.write_.shared_alloc_;
}

Assistant:

Read<T> interleave(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  auto narrays = LO(arrays.size());
  auto array_size = arrays.front().size();
  for (auto& array : arrays) OMEGA_H_CHECK(array.size() == array_size);
  auto out_size = narrays * array_size;
  auto out = Write<T>(out_size);
  for (LO i = 0; i < narrays; ++i) {
    auto array = arrays[std::size_t(i)];
    auto f = OMEGA_H_LAMBDA(LO j) { out[j * narrays + i] = array[j]; };
    parallel_for(array_size, f, "interleave");
  }
  return out;
}